

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::SeekToLast(Iter *this)

{
  bool bVar1;
  uint64_t uVar2;
  Iter *in_RDI;
  bool bVar3;
  Iter *unaff_retaddr;
  Iter *in_stack_00000028;
  
  SeekToRestartPoint(unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  do {
    bVar1 = ParseNextKey(in_stack_00000028);
    bVar3 = false;
    if (bVar1) {
      uVar2 = NextEntryOffset(in_RDI);
      bVar3 = uVar2 < in_RDI->restarts_;
    }
  } while (bVar3);
  return;
}

Assistant:

void SeekToLast() override {
    SeekToRestartPoint(num_restarts_ - 1);
    while (ParseNextKey() && NextEntryOffset() < restarts_) {
      // Keep skipping
    }
  }